

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkInTranslation.cpp
# Opt level: O0

void __thiscall
TPZChunkInTranslation::TPZChunkInTranslation
          (TPZChunkInTranslation *this,int64_t *objId,int *classId,TPZContBufferedStream *oldStream,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *versionInfo)

{
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffa0;
  TPZContBufferedStream *in_stack_ffffffffffffffa8;
  TPZContBufferedStream *this_00;
  
  *in_RDI = &PTR__TPZChunkInTranslation_023db698;
  this_00 = (TPZContBufferedStream *)(in_RDI + 1);
  TPZContBufferedStream::TPZContBufferedStream(this_00,in_stack_ffffffffffffffa8);
  TPZContBufferedStream::TPZContBufferedStream(this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x112f8dd);
  in_RDI[0x19] = *in_RSI;
  *(undefined4 *)(in_RDI + 0x1a) = *in_RDX;
  TPZStack<long,_2>::TPZStack((TPZStack<long,_2> *)this_00);
  return;
}

Assistant:

TPZChunkInTranslation::TPZChunkInTranslation(const int64_t &objId, const int &classId, const TPZContBufferedStream &oldStream, const std::map<std::string, uint64_t> &versionInfo) :
mOldStream(oldStream),
mObjId(objId),
mClassId(classId),
mOldVersion(versionInfo) {
}